

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall
btMultiBody::stepPositionsMultiDof::anon_struct_1_0_00000001::operator()
          (anon_struct_1_0_00000001 *this,btVector3 *omega,btQuaternion *quat,bool baseBody,
          btScalar dt)

{
  byte in_CL;
  undefined8 *in_RDX;
  btScalar *in_RSI;
  float in_XMM0_Da;
  btScalar bVar1;
  btVector3 bVar2;
  btQuaternion bVar3;
  btScalar fAngle;
  btVector3 angvel;
  btVector3 axis;
  btScalar *in_stack_fffffffffffffed8;
  btVector3 *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar7;
  btVector3 *in_stack_ffffffffffffff08;
  btVector3 *this_00;
  btQuaternion *in_stack_ffffffffffffff10;
  btQuaternion *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  float local_54;
  btVector3 local_40;
  btVector3 local_30;
  float local_20;
  byte local_19;
  undefined8 *local_18;
  btScalar *local_10;
  
  local_19 = in_CL & 1;
  local_20 = in_XMM0_Da;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btVector3::btVector3(&local_30);
  btVector3::btVector3(&local_40);
  if ((local_19 & 1) == 0) {
    bVar2 = quatRotate(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_40.m_floats._0_8_ = bVar2.m_floats._0_8_;
    local_40.m_floats._8_8_ = bVar2.m_floats._8_8_;
  }
  else {
    local_40.m_floats._0_8_ = *(undefined8 *)local_10;
    local_40.m_floats._8_8_ = *(undefined8 *)(local_10 + 2);
  }
  local_54 = btVector3::length((btVector3 *)0x240f5c);
  if (0.7853982 < local_54 * local_20) {
    local_54 = 0.7853982 / local_20;
  }
  if (0.001 <= local_54) {
    btSin(0.0);
    bVar2 = ::operator*((btVector3 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        (btScalar *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    local_30.m_floats._0_8_ = bVar2.m_floats._0_8_;
    local_30.m_floats._8_8_ = bVar2.m_floats._8_8_;
  }
  else {
    bVar2 = ::operator*((btVector3 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        (btScalar *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    local_30.m_floats._0_8_ = bVar2.m_floats._0_8_;
    local_30.m_floats._8_8_ = bVar2.m_floats._8_8_;
  }
  if ((local_19 & 1) == 0) {
    this_00 = &local_30;
    btVector3::x(this_00);
    btVector3::y(this_00);
    btVector3::z(this_00);
    bVar1 = btCos(0.0);
    btQuaternion::btQuaternion
              ((btQuaternion *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (btScalar *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee0->m_floats,in_stack_fffffffffffffed8,(btScalar *)0x24116a);
    bVar3 = ::operator*((btQuaternion *)CONCAT44(in_stack_ffffffffffffff64,bVar1),
                        in_stack_ffffffffffffff58);
    *local_18 = bVar3.super_btQuadWord.m_floats._0_8_;
    local_18[1] = bVar3.super_btQuadWord.m_floats._8_8_;
  }
  else {
    in_stack_fffffffffffffee0 = &local_30;
    btVector3::x(in_stack_fffffffffffffee0);
    uVar4 = 0x80000000;
    uVar5 = 0x80000000;
    uVar6 = 0x80000000;
    uVar7 = 0x80000000;
    btVector3::y(in_stack_fffffffffffffee0);
    btVector3::z(in_stack_fffffffffffffee0);
    btCos(0.0);
    btQuaternion::btQuaternion
              ((btQuaternion *)CONCAT44(uVar7,uVar6),(btScalar *)CONCAT44(uVar5,uVar4),
               in_stack_fffffffffffffee0->m_floats,in_stack_fffffffffffffed8,(btScalar *)0x241275);
    bVar3 = ::operator*((btQuaternion *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58);
    *local_18 = bVar3.super_btQuadWord.m_floats._0_8_;
    local_18[1] = bVar3.super_btQuadWord.m_floats._8_8_;
  }
  btQuaternion::normalize((btQuaternion *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

void operator() (const btVector3 &omega, btQuaternion &quat, bool baseBody, btScalar dt)
		{
			//baseBody	=>	quat is alias and omega is global coor
			//!baseBody	=>	quat is alibi and omega is local coor	
			
			btVector3 axis;
			btVector3 angvel;

			if(!baseBody)			
				angvel = quatRotate(quat, omega);				//if quat is not m_baseQuat, it is alibi => ok			
			else
				angvel = omega;
		
			btScalar fAngle = angvel.length(); 		
			//limit the angular motion
			if (fAngle * dt > ANGULAR_MOTION_THRESHOLD)
			{
				fAngle = btScalar(0.5)*SIMD_HALF_PI / dt;
			}

			if ( fAngle < btScalar(0.001) )
			{
				// use Taylor's expansions of sync function
				axis   = angvel*( btScalar(0.5)*dt-(dt*dt*dt)*(btScalar(0.020833333333))*fAngle*fAngle );
			}
			else
			{
				// sync(fAngle) = sin(c*fAngle)/t
				axis   = angvel*( btSin(btScalar(0.5)*fAngle*dt)/fAngle );
			}
			
			if(!baseBody)				
				quat = btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat;			
			else			
				quat = quat * btQuaternion(-axis.x(),-axis.y(),-axis.z(),btCos( fAngle*dt*btScalar(0.5) ));
				//equivalent to: quat = (btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat.inverse()).inverse();			
		
			quat.normalize();
		}